

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt,xmlDtdPtr dtd,xmlChar *name,xmlChar *PublicID,
                  xmlChar *SystemID)

{
  int iVar1;
  xmlHashTablePtr hash;
  xmlNotationPtr nota;
  xmlChar *pxVar2;
  _xmlDict *dict;
  
  if (name == (xmlChar *)0x0 || dtd == (xmlDtdPtr)0x0) {
    return (xmlNotationPtr)0x0;
  }
  if (PublicID == (xmlChar *)0x0 && SystemID == (xmlChar *)0x0) {
    return (xmlNotationPtr)0x0;
  }
  hash = (xmlHashTablePtr)dtd->notations;
  if (hash == (xmlHashTablePtr)0x0) {
    if (dtd->doc == (_xmlDoc *)0x0) {
      dict = (xmlDictPtr)0x0;
    }
    else {
      dict = dtd->doc->dict;
    }
    nota = (xmlNotationPtr)0x0;
    hash = xmlHashCreateDict(0,dict);
    dtd->notations = hash;
    if (hash != (xmlHashTablePtr)0x0) goto LAB_00151915;
  }
  else {
LAB_00151915:
    nota = (xmlNotationPtr)(*xmlMalloc)(0x18);
    if (nota == (xmlNotationPtr)0x0) {
      nota = (xmlNotationPtr)0x0;
    }
    else {
      nota->name = (xmlChar *)0x0;
      nota->PublicID = (xmlChar *)0x0;
      nota->SystemID = (xmlChar *)0x0;
      pxVar2 = xmlStrdup(name);
      nota->name = pxVar2;
      if (pxVar2 != (xmlChar *)0x0) {
        if (SystemID != (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(SystemID);
          nota->SystemID = pxVar2;
          if (pxVar2 == (xmlChar *)0x0) goto LAB_001519a1;
        }
        if (PublicID != (xmlChar *)0x0) {
          pxVar2 = xmlStrdup(PublicID);
          nota->PublicID = pxVar2;
          if (pxVar2 == (xmlChar *)0x0) goto LAB_001519a1;
        }
        iVar1 = xmlHashAdd(hash,name,nota);
        if (0 < iVar1) {
          return nota;
        }
        if (-1 < iVar1) {
          xmlErrValid(ctxt,XML_DTD_NOTATION_REDEFINED,"xmlAddNotationDecl: %s already defined\n",
                      (char *)name);
          goto LAB_001519aa;
        }
      }
    }
  }
LAB_001519a1:
  xmlVErrMemory(ctxt);
LAB_001519aa:
  xmlFreeNotation(nota);
  return (xmlNotationPtr)0x0;
}

Assistant:

xmlNotationPtr
xmlAddNotationDecl(xmlValidCtxtPtr ctxt, xmlDtdPtr dtd,
	           const xmlChar *name,
                   const xmlChar *PublicID, const xmlChar *SystemID) {
    xmlNotationPtr ret = NULL;
    xmlNotationTablePtr table;
    int res;

    if (dtd == NULL) {
	return(NULL);
    }
    if (name == NULL) {
	return(NULL);
    }
    if ((PublicID == NULL) && (SystemID == NULL)) {
	return(NULL);
    }

    /*
     * Create the Notation table if needed.
     */
    table = (xmlNotationTablePtr) dtd->notations;
    if (table == NULL) {
	xmlDictPtr dict = NULL;
	if (dtd->doc != NULL)
	    dict = dtd->doc->dict;

        dtd->notations = table = xmlHashCreateDict(0, dict);
        if (table == NULL)
            goto mem_error;
    }

    ret = (xmlNotationPtr) xmlMalloc(sizeof(xmlNotation));
    if (ret == NULL)
        goto mem_error;
    memset(ret, 0, sizeof(xmlNotation));

    /*
     * fill the structure.
     */
    ret->name = xmlStrdup(name);
    if (ret->name == NULL)
        goto mem_error;
    if (SystemID != NULL) {
        ret->SystemID = xmlStrdup(SystemID);
        if (ret->SystemID == NULL)
            goto mem_error;
    }
    if (PublicID != NULL) {
        ret->PublicID = xmlStrdup(PublicID);
        if (ret->PublicID == NULL)
            goto mem_error;
    }

    /*
     * Validity Check:
     * Check the DTD for previous declarations of the ATTLIST
     */
    res = xmlHashAdd(table, name, ret);
    if (res <= 0) {
        if (res < 0)
            goto mem_error;
#ifdef LIBXML_VALID_ENABLED
        xmlErrValid(ctxt, XML_DTD_NOTATION_REDEFINED,
                    "xmlAddNotationDecl: %s already defined\n",
                    (const char *) name);
#endif /* LIBXML_VALID_ENABLED */
	xmlFreeNotation(ret);
	return(NULL);
    }
    return(ret);

mem_error:
    xmlVErrMemory(ctxt);
    xmlFreeNotation(ret);
    return(NULL);
}